

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VDotProdLocal(N_Vector X,N_Vector Y,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  sunrealtype locleninv;
  sunrealtype rmyid;
  sunrealtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunrealtype in_stack_ffffffffffffffb8;
  undefined8 uVar6;
  sunindextype in_stack_ffffffffffffffc0;
  sunindextype in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  int local_20;
  
  local_20 = 0;
  set_element_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
  set_element_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
  dVar2 = get_time();
  uVar3 = N_VDotProdLocal(in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar4 = get_time();
  uVar6 = uVar3;
  dVar5 = sqrt(2.220446049250313e-16);
  iVar1 = SUNRCompareTol(uVar3,(double)(int)in_ECX,SUB84(dVar5,0));
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VDotProdLocal\n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n",(ulong)in_ECX);
    printf("ans = %.17f expected = %.17f\n",uVar6,(double)(int)in_ECX);
    local_20 = 1;
  }
  dVar2 = max_time(in_RDI,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VDotProdLocal");
  }
  return local_20;
}

Assistant:

int Test_N_VDotProdLocal(N_Vector X, N_Vector Y, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, rmyid, locleninv;

  /* fill vector data */
  rmyid     = (sunrealtype)myid;
  locleninv = ONE / local_length;
  set_element_range(X, 0, local_length - 1, rmyid);
  set_element_range(Y, 0, local_length - 1, locleninv);

  start_time = get_time();
  ans        = N_VDotProdLocal(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal rmyid */
  failure = SUNRCompareTol(ans, rmyid, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n", myid);
    printf("ans = %" FSYM " expected = %" FSYM "\n", ans, rmyid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProdLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdLocal", maxt);

  return (fails);
}